

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json_encode_test.c
# Opt level: O3

_Bool uo_json_encode_number_test(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  short sVar5;
  long lVar6;
  undefined2 uVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar8 = uo_json_encode_int64(json,1);
  *pcVar8 = '\0';
  uVar7 = json._0_2_;
  pcVar8 = uo_json_encode_double(json,1.234);
  *pcVar8 = '\0';
  iVar2 = CONCAT13(json[3],CONCAT12(json[2],json._0_2_));
  sVar5 = CONCAT11(json[5],json[4]);
  pcVar8 = uo_json_encode_double(json,1e-05);
  *pcVar8 = '\0';
  if (CONCAT11(json[5],json[4]) == 0x35 &&
      CONCAT13(json[3],CONCAT12(json[2],json._0_2_)) == 0x302d6531) {
    bVar9 = true;
  }
  else {
    bVar9 = CONCAT13(json[6],CONCAT12(json[5],CONCAT11(json[4],json[3]))) == 0x353030 &&
            CONCAT13(json[3],CONCAT12(json[2],json._0_2_)) == 0x302d6531;
  }
  pcVar8 = uo_json_encode_int64(json,-100000000000);
  *pcVar8 = '\0';
  lVar4 = CONCAT17(json[7],CONCAT16(json[6],CONCAT15(json[5],CONCAT14(json[4],CONCAT13(json[3],
                                                  CONCAT12(json[2],json._0_2_))))));
  lVar6 = CONCAT62(json._8_6_,CONCAT11(json[7],json[6]));
  pcVar8 = uo_json_encode_bool(json,true);
  *pcVar8 = '\0';
  iVar3 = CONCAT13(json[3],CONCAT12(json[2],json._0_2_));
  bVar1 = json[4] == '\0';
  pcVar8 = uo_json_encode_bool(json,false);
  *pcVar8 = '\0';
  return (_Bool)(((CONCAT11(json[5],json[4]) == 0x65 &&
                  CONCAT13(json[3],CONCAT12(json[2],json._0_2_)) == 0x736c6166) &&
                 ((bVar1 && iVar3 == 0x65757274) &&
                 (lVar6 == 0x30303030303030 && lVar4 == 0x303030303030312d))) &
                 uVar7 == 0x31 & bVar9 & (sVar5 == 0x34 && iVar2 == 0x33322e31));
}

Assistant:

bool uo_json_encode_number_test(void)
{
    bool passed = true;
    char *end;

    end = uo_json_encode(json, 1);
    *end = '\0';
    passed &= strcmp(json, "1") == 0;

    end = uo_json_encode(json, 1.234);
    *end = '\0';
    passed &= strcmp(json, "1.234") == 0;

    end = uo_json_encode(json, 0.00001);
    *end = '\0';
    passed &= (strcmp(json, "1e-05") == 0 || strcmp(json, "1e-005") == 0);

    end = uo_json_encode(json, -100000000000);
    *end = '\0';
    passed &= strcmp(json, "-100000000000") == 0;

    bool t = true;
    end = uo_json_encode(json, t);
    *end = '\0';
    passed &= strcmp(json, "true") == 0;

    bool f = false;
    end = uo_json_encode(json, f);
    *end = '\0';
    passed &= strcmp(json, "false") == 0;

    return passed;
}